

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.cc
# Opt level: O2

void RigidBodyDynamics::jcalc(Model *model,uint joint_id,VectorNd *q,VectorNd *qdot)

{
  double dVar1;
  JointType JVar2;
  uint uVar3;
  pointer pJVar4;
  double *pdVar5;
  pointer pSVar6;
  pointer pSVar7;
  CustomJoint *pCVar8;
  pointer pMVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  pointer pSVar18;
  ostream *poVar19;
  RBDLError *this;
  long lVar20;
  SpatialTransform *pSVar21;
  pointer pSVar22;
  byte bVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  Vector3d St;
  string local_1e8;
  ostringstream errormsg;
  double local_180;
  double dStack_178;
  double local_170;
  Vector3d c;
  
  bVar23 = 0;
  pJVar4 = (model->mJoints).
           super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
           .
           super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  JVar2 = pJVar4[joint_id].mJointType;
  if (JVar2 == JointTypeHelical) {
    jcalc_XJ((SpatialTransform *)&errormsg,model,joint_id,q);
    pSVar6 = (model->X_J).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar21 = (SpatialTransform *)&errormsg;
    pSVar22 = pSVar6 + joint_id;
    for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
      *(double *)&(pSVar22->E).super_Matrix3d =
           (pSVar21->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0];
      pSVar21 = (SpatialTransform *)((long)pSVar21 + (ulong)bVar23 * -0x10 + 8);
      pSVar22 = (pointer)((long)pSVar22 + ((ulong)bVar23 * -2 + 1) * 8);
    }
    *(double *)((long)&pSVar6[joint_id].r.super_Vector3d + 0x10) = local_170;
    *(double *)
     &pSVar6[joint_id].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         = local_180;
    *(double *)
     ((long)&pSVar6[joint_id].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) = dStack_178;
    jcalc_X_lambda_S(model,joint_id,q);
    dVar10 = (qdot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
             [(model->mJoints).
              super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
              .
              super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
              ._M_impl.super__Vector_impl_data._M_start[joint_id].q_index];
    _errormsg = (pointer)((model->S).
                          super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                          ._M_impl.super__Vector_impl_data._M_start + joint_id);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>>
              (&(model->v_J).
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start[joint_id].
                super_Matrix<double,_6,_1,_0,_6,_1>,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                *)&errormsg);
    _errormsg = (pointer)((model->S).
                          super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                          ._M_impl.super__Vector_impl_data._M_start + joint_id);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&St,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false>_> *)
               &errormsg);
    _errormsg = (model->X_J).
                super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                .
                super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                ._M_impl.super__Vector_impl_data._M_start + joint_id;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&c,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false>,_0>_>
                *)&errormsg);
    _errormsg = (pointer)(c.super_Vector3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2] *
                          St.super_Vector3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[1] -
                         St.super_Vector3d.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[2] *
                         c.super_Vector3d.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[1]);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)&c,(Matrix<double,_3,_1,_0,_3,_1> *)&errormsg);
    _errormsg = (pointer)(-dVar10 * dVar10);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&c,(Scalar *)&errormsg);
    pSVar7 = (model->c_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    *(double *)
     ((long)&pSVar7[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = 0.0;
    *(undefined8 *)
     &pSVar7[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
    *(double *)
     ((long)&pSVar7[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
    pdVar5 = (double *)
             ((long)&pSVar7[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
    *pdVar5 = c.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0];
    pdVar5[1] = c.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[1];
    *(double *)
     ((long)&pSVar7[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) =
         c.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
    goto LAB_00240e3a;
  }
  if (JVar2 == JointTypeRevoluteY) {
    uVar3 = pJVar4[joint_id].q_index;
    pdVar5 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar10 = sin(pdVar5[uVar3]);
    dVar11 = cos(pdVar5[uVar3]);
    pSVar6 = (model->X_J).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(double *)&pSVar6[joint_id].E.super_Matrix3d = dVar11;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 8) = 0.0;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x10) = dVar10;
    pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x18);
    *pdVar5 = 0.0;
    pdVar5[1] = 1.0;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x28) = 0.0;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x30) = -dVar10;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x38) = 0.0;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x40) = dVar11;
    *(double *)((long)&pSVar6[joint_id].r.super_Vector3d + 0x10) = 0.0;
    *(undefined8 *)
     &pSVar6[joint_id].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         = 0;
    *(double *)
     ((long)&pSVar6[joint_id].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) = 0.0;
    *(double *)
     ((long)&(model->v_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
         (qdot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
         [(model->mJoints).
          super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          .
          super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ._M_impl.super__Vector_impl_data._M_start[joint_id].q_index];
    goto LAB_00240e3a;
  }
  if (JVar2 == JointTypeRevoluteZ) {
    uVar3 = pJVar4[joint_id].q_index;
    pdVar5 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar10 = sin(pdVar5[uVar3]);
    dVar11 = cos(pdVar5[uVar3]);
    pSVar6 = (model->X_J).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(double *)&pSVar6[joint_id].E.super_Matrix3d = dVar11;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 8) = -dVar10;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x10) = 0.0;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x18) = dVar10;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x20) = dVar11;
    pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x28);
    *pdVar5 = 0.0;
    pdVar5[1] = 0.0;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x38) = 0.0;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x40) = 1.0;
    *(double *)((long)&pSVar6[joint_id].r.super_Vector3d + 0x10) = 0.0;
    *(undefined8 *)
     &pSVar6[joint_id].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         = 0;
    *(double *)
     ((long)&pSVar6[joint_id].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) = 0.0;
    *(double *)
     ((long)&(model->v_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) =
         (qdot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
         [(model->mJoints).
          super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          .
          super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ._M_impl.super__Vector_impl_data._M_start[joint_id].q_index];
    goto LAB_00240e3a;
  }
  if (JVar2 == JointTypeRevoluteX) {
    uVar3 = pJVar4[joint_id].q_index;
    pdVar5 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar10 = sin(pdVar5[uVar3]);
    dVar11 = cos(pdVar5[uVar3]);
    pSVar6 = (model->X_J).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)&pSVar6[joint_id].E.super_Matrix3d = 0x3ff0000000000000;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x18) = 0.0;
    pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 8);
    *pdVar5 = 0.0;
    pdVar5[1] = 0.0;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x20) = dVar11;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x28) = -dVar10;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x30) = 0.0;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x38) = dVar10;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x40) = dVar11;
    *(double *)((long)&pSVar6[joint_id].r.super_Vector3d + 0x10) = 0.0;
    *(undefined8 *)
     &pSVar6[joint_id].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         = 0;
    *(double *)
     ((long)&pSVar6[joint_id].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) = 0.0;
    *(double *)
     &(model->v_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
      super__Vector_impl_data._M_start[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
         (qdot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
         [(model->mJoints).
          super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          .
          super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ._M_impl.super__Vector_impl_data._M_start[joint_id].q_index];
    goto LAB_00240e3a;
  }
  if (pJVar4[joint_id].mDoFCount == 1) {
    if (JVar2 != JointTypeCustom) {
      jcalc_XJ((SpatialTransform *)&errormsg,model,joint_id,q);
      pSVar6 = (model->X_J).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar21 = (SpatialTransform *)&errormsg;
      pSVar22 = pSVar6 + joint_id;
      for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(double *)&(pSVar22->E).super_Matrix3d =
             (pSVar21->E).super_Matrix3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
        pSVar21 = (SpatialTransform *)((long)pSVar21 + (ulong)bVar23 * -0x10 + 8);
        pSVar22 = (pointer)((long)pSVar22 + ((ulong)bVar23 * -2 + 1) * 8);
      }
      *(double *)((long)&pSVar6[joint_id].r.super_Vector3d + 0x10) = local_170;
      *(double *)
       &pSVar6[joint_id].r.super_Vector3d.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> = local_180;
      *(double *)
       ((long)&pSVar6[joint_id].r.super_Vector3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) = dStack_178;
      _errormsg = (pointer)((model->S).
                            super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                            .
                            super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                            ._M_impl.super__Vector_impl_data._M_start + joint_id);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>>
                (&(model->v_J).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start[joint_id].
                  super_Matrix<double,_6,_1,_0,_6,_1>,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                  *)&errormsg);
      goto LAB_00240e3a;
    }
switchD_002403c7_caseD_14:
    pCVar8 = (model->mCustomJoints).
             super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
             ._M_impl.super__Vector_impl_data._M_start[pJVar4[joint_id].custom_joint_index];
    (**(code **)(*(long *)pCVar8 + 0x10))(pCVar8,model,joint_id,q,qdot);
    goto LAB_00240e3a;
  }
  switch(JVar2) {
  case JointTypeSpherical:
    Model::GetQuaternion((Quaternion *)&St,model,joint_id,q);
    Math::Quaternion::toMatrix((Quaternion *)&St);
    pSVar6 = (model->X_J).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    memmove(pSVar6 + joint_id,&errormsg,0x48);
    *(double *)((long)&pSVar6[joint_id].r.super_Vector3d + 0x10) = 0.0;
    *(undefined8 *)
     &pSVar6[joint_id].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         = 0;
    *(double *)
     ((long)&pSVar6[joint_id].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) = 0.0;
    pMVar9 = (model->multdof3_S).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)
     &pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage =
         0x3ff0000000000000;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x38) = 1.0;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x70) = 1.0;
    pSVar7 = (model->v_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar3 = (model->mJoints).
            super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            .
            super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            ._M_impl.super__Vector_impl_data._M_start[joint_id].q_index;
    pdVar5 = (qdot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    dVar10 = pdVar5[uVar3 + 1];
    dVar11 = pdVar5[uVar3 + 2];
    *(double *)
     &pSVar7[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = pdVar5[uVar3];
    *(double *)
     ((long)&pSVar7[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = dVar10;
    *(double *)
     ((long)&pSVar7[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = dVar11;
    pdVar5 = (double *)
             ((long)&pSVar7[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
    *pdVar5 = 0.0;
    pdVar5[1] = 0.0;
    *(double *)
     ((long)&pSVar7[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = 0.0;
    goto LAB_00240e3a;
  case JointTypeEulerZYX:
    uVar3 = pJVar4[joint_id].q_index;
    pdVar5 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar10 = pdVar5[uVar3];
    dVar11 = pdVar5[uVar3 + 1];
    dVar1 = pdVar5[uVar3 + 2];
    dVar12 = sin(dVar10);
    dVar10 = cos(dVar10);
    dVar13 = sin(dVar11);
    dVar14 = cos(dVar11);
    dVar15 = sin(dVar1);
    dVar1 = cos(dVar1);
    dVar24 = dVar14 * dVar15;
    dVar25 = dVar14 * dVar1;
    pSVar6 = (model->X_J).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(double *)&pSVar6[joint_id].E.super_Matrix3d = dVar10 * dVar14;
    pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 8);
    *pdVar5 = dVar10 * dVar13 * dVar15 + -dVar12 * dVar1;
    pdVar5[1] = dVar10 * dVar13 * dVar1 + dVar15 * dVar12;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x18) = dVar12 * dVar14;
    pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x20);
    *pdVar5 = dVar12 * dVar13 * dVar15 + dVar1 * dVar10;
    pdVar5[1] = dVar12 * dVar13 * dVar1 + -dVar10 * dVar15;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x30) = -dVar13;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x38) = dVar24;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x40) = dVar25;
    pMVar9 = (model->multdof3_S).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    St.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = (double)(pMVar9 + joint_id);
    *(double *)
     &pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage =
         -dVar13;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x60) = 1.0;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 8) = dVar24;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x38) = dVar1;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x10) = dVar25;
    uVar3 = (model->mJoints).
            super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            .
            super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            ._M_impl.super__Vector_impl_data._M_start[joint_id].q_index;
    pdVar5 = (qdot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x40) = -dVar15;
    pSVar7 = (pointer)pdVar5[uVar3];
    dVar10 = pdVar5[uVar3 + 1];
    dVar11 = pdVar5[uVar3 + 2];
    St.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = (double)&errormsg;
    _errormsg = (pointer)pSVar7;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              (&(model->v_J).
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start[joint_id].
                super_Matrix<double,_6,_1,_0,_6,_1>,
               (Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
                *)&St);
    pSVar18 = (model->c_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
              .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
              _M_impl.super__Vector_impl_data._M_start;
    dVar1 = (-dVar24 * (double)pSVar7 * dVar11 - dVar13 * dVar1 * (double)pSVar7 * dVar10) -
            dVar10 * dVar1 * dVar11;
    *(double *)
     &pSVar18[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
         -dVar14 * (double)pSVar7 * dVar10;
    auVar17._8_4_ = SUB84(dVar1,0);
    auVar17._0_8_ =
         (dVar25 * (double)pSVar7 * dVar11 - dVar13 * dVar15 * (double)pSVar7 * dVar10) -
         dVar10 * dVar15 * dVar11;
    auVar17._12_4_ = (int)((ulong)dVar1 >> 0x20);
    *(undefined1 (*) [16])
     ((long)&pSVar18[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = auVar17;
    goto LAB_00240e2a;
  case JointTypeEulerXYZ:
    uVar3 = pJVar4[joint_id].q_index;
    pdVar5 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar10 = pdVar5[uVar3];
    dVar11 = pdVar5[uVar3 + 1];
    dVar1 = pdVar5[uVar3 + 2];
    dVar12 = sin(dVar10);
    dVar10 = cos(dVar10);
    dVar13 = sin(dVar11);
    dVar14 = cos(dVar11);
    dVar15 = sin(dVar1);
    dVar24 = cos(dVar1);
    pSVar6 = (model->X_J).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(double *)&pSVar6[joint_id].E.super_Matrix3d = dVar14 * dVar24;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x10) = dVar13;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x28) = -dVar14 * dVar12;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x40) = dVar10 * dVar14;
    dVar26 = -dVar15;
    dVar25 = dVar14 * dVar26;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 8) = dVar25;
    dVar27 = -dVar24 * dVar13;
    pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x18);
    *pdVar5 = dVar15 * dVar10 + dVar13 * dVar24 * dVar12;
    pdVar5[1] = dVar24 * dVar10 + dVar13 * dVar26 * dVar12;
    pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x30);
    *pdVar5 = dVar15 * dVar12 + dVar10 * dVar27;
    pdVar5[1] = dVar24 * dVar12 + dVar10 * dVar15 * dVar13;
    pMVar9 = (model->multdof3_S).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    St.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = (double)(pMVar9 + joint_id);
    *(double *)
     &pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage =
         dVar14 * dVar24;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x30) = dVar15;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 8) = dVar25;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x38) = dVar24;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x10) = dVar13;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x70) = 1.0;
    uVar3 = (model->mJoints).
            super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            .
            super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            ._M_impl.super__Vector_impl_data._M_start[joint_id].q_index;
    pdVar5 = (qdot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    pSVar7 = (pointer)pdVar5[uVar3];
    dVar10 = pdVar5[uVar3 + 1];
    dVar11 = pdVar5[uVar3 + 2];
    St.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = (double)&errormsg;
    _errormsg = (pointer)pSVar7;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              (&(model->v_J).
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start[joint_id].
                super_Matrix<double,_6,_1,_0,_6,_1>,
               (Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
                *)&St);
    pSVar18 = (model->c_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
              .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
              _M_impl.super__Vector_impl_data._M_start;
    dVar1 = dVar14 * dVar10 * (double)pSVar7;
    *(double *)
     &pSVar18[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
         dVar11 * dVar24 * dVar10 +
         (double)pSVar7 * dVar25 * dVar11 + dVar27 * dVar10 * (double)pSVar7;
    *(double *)
     ((long)&pSVar18[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
         dVar11 * dVar26 * dVar10 +
         (double)pSVar7 * dVar14 * -dVar24 * dVar11 + dVar15 * dVar13 * dVar10 * (double)pSVar7;
    break;
  case JointTypeEulerYXZ:
    uVar3 = pJVar4[joint_id].q_index;
    pdVar5 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar10 = pdVar5[uVar3];
    dVar11 = pdVar5[uVar3 + 1];
    dVar1 = pdVar5[uVar3 + 2];
    dVar12 = sin(dVar10);
    dVar10 = cos(dVar10);
    dVar13 = sin(dVar11);
    dVar14 = cos(dVar11);
    dVar15 = sin(dVar1);
    dVar1 = cos(dVar1);
    pSVar6 = (model->X_J).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar25 = dVar13 * dVar15;
    dVar26 = dVar13 * dVar1;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x10) = dVar12 * dVar14;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x18) = dVar14 * dVar15;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x40) = dVar10 * dVar14;
    dVar24 = -dVar15;
    dVar27 = dVar14 * dVar1;
    *(double *)&pSVar6[joint_id].E.super_Matrix3d = dVar1 * dVar10 + dVar12 * dVar25;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 8) = dVar24 * dVar10 + dVar12 * dVar26;
    pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x20);
    *pdVar5 = dVar27;
    pdVar5[1] = -dVar13;
    pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x30);
    *pdVar5 = -dVar1 * dVar12 + dVar10 * dVar25;
    pdVar5[1] = dVar15 * dVar12 + dVar10 * dVar26;
    pMVar9 = (model->multdof3_S).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    St.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = (double)(pMVar9 + joint_id);
    *(double *)
     &pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage =
         dVar14 * dVar15;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x30) = dVar1;
    pdVar5 = (double *)
             ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                     m_storage + 8);
    *pdVar5 = dVar27;
    pdVar5[1] = -dVar13;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x38) = dVar24;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x70) = 1.0;
    uVar3 = (model->mJoints).
            super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            .
            super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            ._M_impl.super__Vector_impl_data._M_start[joint_id].q_index;
    pdVar5 = (qdot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    pSVar7 = (pointer)pdVar5[uVar3];
    dVar10 = pdVar5[uVar3 + 1];
    dVar11 = pdVar5[uVar3 + 2];
    St.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = (double)&errormsg;
    _errormsg = (pointer)pSVar7;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              (&(model->v_J).
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start[joint_id].
                super_Matrix<double,_6,_1,_0,_6,_1>,
               (Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
                *)&St);
    pSVar18 = (model->c_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
              .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
              _M_impl.super__Vector_impl_data._M_start;
    dVar12 = ((double)pSVar7 * dVar14 * dVar24 * dVar11 - dVar26 * dVar10 * (double)pSVar7) -
             dVar11 * dVar1 * dVar10;
    dVar1 = -dVar14 * dVar10 * (double)pSVar7;
    auVar16._8_4_ = SUB84(dVar12,0);
    auVar16._0_8_ =
         ((double)pSVar7 * dVar27 * dVar11 - dVar25 * dVar10 * (double)pSVar7) -
         dVar11 * dVar15 * dVar10;
    auVar16._12_4_ = (int)((ulong)dVar12 >> 0x20);
    *(undefined1 (*) [16])
     &pSVar18[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar16;
    break;
  case JointTypeTranslationXYZ:
    uVar3 = pJVar4[joint_id].q_index;
    pdVar5 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar10 = pdVar5[uVar3];
    dVar11 = pdVar5[uVar3 + 1];
    dVar1 = pdVar5[uVar3 + 2];
    pSVar6 = (model->X_J).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)&pSVar6[joint_id].E.super_Matrix3d = 0x3ff0000000000000;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x18) = 0.0;
    pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 8);
    *pdVar5 = 0.0;
    pdVar5[1] = 0.0;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x20) = 1.0;
    pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x28);
    *pdVar5 = 0.0;
    pdVar5[1] = 0.0;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x38) = 0.0;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x40) = 1.0;
    pSVar6 = (model->X_J).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(double *)
     &pSVar6[joint_id].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         = dVar10;
    *(double *)((long)&pSVar6[joint_id].r.super_Vector3d + 8) = dVar11;
    *(double *)((long)&pSVar6[joint_id].r.super_Vector3d + 0x10) = dVar1;
    pMVar9 = (model->multdof3_S).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    St.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = (double)(pMVar9 + joint_id);
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x18) = 1.0;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x50) = 1.0;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x88) = 1.0;
    _errormsg = (pointer)(qdot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data
                         [(model->mJoints).
                          super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                          .
                          super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                          ._M_impl.super__Vector_impl_data._M_start[joint_id].q_index];
    St.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = (double)&errormsg;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              (&(model->v_J).
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start[joint_id].
                super_Matrix<double,_6,_1,_0,_6,_1>,
               (Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
                *)&St);
    pSVar7 = (model->c_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    pdVar5 = (double *)
             ((long)&pSVar7[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
    *pdVar5 = 0.0;
    pdVar5[1] = 0.0;
    pdVar5 = (double *)
             ((long)&pSVar7[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
    *pdVar5 = 0.0;
    pdVar5[1] = 0.0;
    *(undefined8 *)
     &pSVar7[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
    *(double *)
     ((long)&pSVar7[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
    goto LAB_00240e3a;
  default:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&errormsg);
    poVar19 = std::operator<<((ostream *)&errormsg,"Error: invalid joint type ");
    poVar19 = (ostream *)
              std::ostream::operator<<
                        ((ostream *)poVar19,
                         (model->mJoints).
                         super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         ._M_impl.super__Vector_impl_data._M_start[joint_id].mJointType);
    poVar19 = std::operator<<(poVar19," at id ");
    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
    std::endl<char,std::char_traits<char>>(poVar19);
    this = (RBDLError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    Errors::RBDLError::RBDLError(this,&local_1e8);
    __cxa_throw(this,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
  case JointTypeCustom:
    goto switchD_002403c7_caseD_14;
  }
  *(double *)
   ((long)&pSVar18[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = dVar1;
LAB_00240e2a:
  pdVar5 = (double *)
           ((long)&pSVar18[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
  *pdVar5 = 0.0;
  pdVar5[1] = 0.0;
  *(double *)
   ((long)&pSVar18[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = 0.0;
LAB_00240e3a:
  Math::SpatialTransform::operator*
            ((SpatialTransform *)&errormsg,
             (model->X_J).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start + joint_id,
             (model->X_T).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start + joint_id);
  pSVar6 = (model->X_lambda).
           super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
           .
           super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar21 = (SpatialTransform *)&errormsg;
  pSVar22 = pSVar6 + joint_id;
  for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
    *(double *)&(pSVar22->E).super_Matrix3d =
         (pSVar21->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[0];
    pSVar21 = (SpatialTransform *)((long)pSVar21 + (ulong)bVar23 * -0x10 + 8);
    pSVar22 = (pointer)((long)pSVar22 + ((ulong)bVar23 * -2 + 1) * 8);
  }
  *(double *)((long)&pSVar6[joint_id].r.super_Vector3d + 0x10) = local_170;
  *(double *)
   &pSVar6[joint_id].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> =
       local_180;
  *(double *)
   ((long)&pSVar6[joint_id].r.super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) = dStack_178;
  return;
}

Assistant:

RBDL_DLLAPI void jcalc (
    Model &model,
    unsigned int joint_id,
    const VectorNd &q,
    const VectorNd &qdot
    ) {
  // exception if we calculate it for the root body
  assert (joint_id > 0);

  if (model.mJoints[joint_id].mJointType == JointTypeRevoluteX) {
    model.X_J[joint_id] = Xrotx (q[model.mJoints[joint_id].q_index]);
    model.v_J[joint_id][0] = qdot[model.mJoints[joint_id].q_index];
  } else if (model.mJoints[joint_id].mJointType == JointTypeRevoluteY) {
    model.X_J[joint_id] = Xroty (q[model.mJoints[joint_id].q_index]);
    model.v_J[joint_id][1] = qdot[model.mJoints[joint_id].q_index];
  } else if (model.mJoints[joint_id].mJointType == JointTypeRevoluteZ) {
    model.X_J[joint_id] = Xrotz (q[model.mJoints[joint_id].q_index]);
    model.v_J[joint_id][2] = qdot[model.mJoints[joint_id].q_index];
  } else if (model.mJoints[joint_id].mJointType == JointTypeHelical) {
    model.X_J[joint_id] = jcalc_XJ (model, joint_id, q);
    jcalc_X_lambda_S(model, joint_id, q);
    Scalar Jqd = qdot[model.mJoints[joint_id].q_index];
    model.v_J[joint_id] = model.S[joint_id] * Jqd;

    Vector3d St = model.S[joint_id].block<3, 1>(0,0);
    Vector3d c = model.X_J[joint_id].E * model.mJoints[joint_id].mJointAxes[0].block<3, 1>(3,0);
    c = St.cross(c);
    c *= -Jqd * Jqd;    
    model.c_J[joint_id] = SpatialVector(0,0,0,c[0],c[1],c[2]);
  } else if (model.mJoints[joint_id].mDoFCount == 1 &&
      model.mJoints[joint_id].mJointType != JointTypeCustom) {
    model.X_J[joint_id] = jcalc_XJ (model, joint_id, q);
    model.v_J[joint_id] = 
      model.S[joint_id] * qdot[model.mJoints[joint_id].q_index];
  } else if (model.mJoints[joint_id].mJointType == JointTypeSpherical) {
    model.X_J[joint_id] = 
      SpatialTransform (model.GetQuaternion (joint_id, q).toMatrix(), 
          Vector3d (0., 0., 0.));

    model.multdof3_S[joint_id](0,0) = 1.;
    model.multdof3_S[joint_id](1,1) = 1.;
    model.multdof3_S[joint_id](2,2) = 1.;

    Vector3d omega (qdot[model.mJoints[joint_id].q_index],
        qdot[model.mJoints[joint_id].q_index+1],
        qdot[model.mJoints[joint_id].q_index+2]);

    model.v_J[joint_id] = SpatialVector (
        omega[0], omega[1], omega[2],
        0., 0., 0.);
  } else if (model.mJoints[joint_id].mJointType == JointTypeEulerZYX) {
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    Scalar s0 = sin (q0);
    Scalar c0 = cos (q0);
    Scalar s1 = sin (q1);
    Scalar c1 = cos (q1);
    Scalar s2 = sin (q2);
    Scalar c2 = cos (q2);

    model.X_J[joint_id].E = Matrix3d(
        c0 * c1, s0 * c1, -s1,
        c0 * s1 * s2 - s0 * c2, s0 * s1 * s2 + c0 * c2, c1 * s2,
        c0 * s1 * c2 + s0 * s2, s0 * s1 * c2 - c0 * s2, c1 * c2
        );

    model.multdof3_S[joint_id](0,0) = -s1;
    model.multdof3_S[joint_id](0,2) = 1.;

    model.multdof3_S[joint_id](1,0) = c1 * s2;
    model.multdof3_S[joint_id](1,1) = c2;

    model.multdof3_S[joint_id](2,0) = c1 * c2;
    model.multdof3_S[joint_id](2,1) = - s2;

    Scalar qdot0 = qdot[model.mJoints[joint_id].q_index];
    Scalar qdot1 = qdot[model.mJoints[joint_id].q_index + 1];
    Scalar qdot2 = qdot[model.mJoints[joint_id].q_index + 2];

    model.v_J[joint_id] = 
      model.multdof3_S[joint_id] * Vector3d (qdot0, qdot1, qdot2);

    model.c_J[joint_id].set(
        -c1*qdot0*qdot1,
        -s1*s2*qdot0*qdot1 + c1*c2*qdot0*qdot2 - s2*qdot1*qdot2,
        -s1*c2*qdot0*qdot1 - c1*s2*qdot0*qdot2 - c2*qdot1*qdot2,
        0.,0., 0.);
  } else if (model.mJoints[joint_id].mJointType == JointTypeEulerXYZ) {
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    Scalar s0 = sin (q0);
    Scalar c0 = cos (q0);
    Scalar s1 = sin (q1);
    Scalar c1 = cos (q1);
    Scalar s2 = sin (q2);
    Scalar c2 = cos (q2);

    model.X_J[joint_id].E = Matrix3d(
        c2 * c1, s2 * c0 + c2 * s1 * s0, s2 * s0 - c2 * s1 * c0,
        -s2 * c1, c2 * c0 - s2 * s1 * s0, c2 * s0 + s2 * s1 * c0,
        s1, -c1 * s0, c1 * c0
        );

    model.multdof3_S[joint_id](0,0) = c2 * c1;
    model.multdof3_S[joint_id](0,1) = s2;

    model.multdof3_S[joint_id](1,0) = -s2 * c1;
    model.multdof3_S[joint_id](1,1) = c2;

    model.multdof3_S[joint_id](2,0) = s1;
    model.multdof3_S[joint_id](2,2) = 1.;

    Scalar qdot0 = qdot[model.mJoints[joint_id].q_index];
    Scalar qdot1 = qdot[model.mJoints[joint_id].q_index + 1];
    Scalar qdot2 = qdot[model.mJoints[joint_id].q_index + 2];

    model.v_J[joint_id] = 
      model.multdof3_S[joint_id] * Vector3d (qdot0, qdot1, qdot2);

    model.c_J[joint_id].set(
        -s2*c1*qdot2*qdot0 - c2*s1*qdot1*qdot0 + c2*qdot2*qdot1,
        -c2*c1*qdot2*qdot0 + s2*s1*qdot1*qdot0 - s2*qdot2*qdot1,
        c1*qdot1*qdot0,
        0., 0., 0.
        );
  } else if (model.mJoints[joint_id].mJointType == JointTypeEulerYXZ) {
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    Scalar s0 = sin (q0);
    Scalar c0 = cos (q0);
    Scalar s1 = sin (q1);
    Scalar c1 = cos (q1);
    Scalar s2 = sin (q2);
    Scalar c2 = cos (q2);

    model.X_J[joint_id].E = Matrix3d(
        c2 * c0 + s2 * s1 * s0, s2 * c1, -c2 * s0 + s2 * s1 * c0,
        -s2 * c0 + c2 * s1 * s0, c2 * c1,  s2 * s0 + c2 * s1 * c0,
        c1 * s0,    - s1,                 c1 * c0);

    model.multdof3_S[joint_id](0,0) = s2 * c1;
    model.multdof3_S[joint_id](0,1) = c2;

    model.multdof3_S[joint_id](1,0) = c2 * c1;
    model.multdof3_S[joint_id](1,1) = -s2;

    model.multdof3_S[joint_id](2,0) = -s1;
    model.multdof3_S[joint_id](2,2) = 1.;

    Scalar qdot0 = qdot[model.mJoints[joint_id].q_index];
    Scalar qdot1 = qdot[model.mJoints[joint_id].q_index + 1];
    Scalar qdot2 = qdot[model.mJoints[joint_id].q_index + 2];

    model.v_J[joint_id] = 
      model.multdof3_S[joint_id] * Vector3d (qdot0, qdot1, qdot2);

    model.c_J[joint_id].set(
        c2*c1*qdot2*qdot0 - s2*s1*qdot1*qdot0 - s2*qdot2*qdot1,
        -s2*c1*qdot2*qdot0 - c2*s1*qdot1*qdot0 - c2*qdot2*qdot1,
        -c1*qdot1*qdot0,
        0., 0., 0.
        );
  } else if(model.mJoints[joint_id].mJointType == JointTypeTranslationXYZ){
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    model.X_J[joint_id].E = Matrix3d::Identity();
    model.X_J[joint_id].r = Vector3d (q0, q1, q2);

    model.multdof3_S[joint_id](3,0) = 1.;
    model.multdof3_S[joint_id](4,1) = 1.;
    model.multdof3_S[joint_id](5,2) = 1.;

    Scalar qdot0 = qdot[model.mJoints[joint_id].q_index];
    Scalar qdot1 = qdot[model.mJoints[joint_id].q_index + 1];
    Scalar qdot2 = qdot[model.mJoints[joint_id].q_index + 2];

    model.v_J[joint_id] = 
      model.multdof3_S[joint_id] * Vector3d (qdot0, qdot1, qdot2);

    model.c_J[joint_id].set(0., 0., 0., 0., 0., 0.);
  } else if (model.mJoints[joint_id].mJointType == JointTypeCustom) {
    const Joint &joint = model.mJoints[joint_id];
    CustomJoint *custom_joint = 
      model.mCustomJoints[joint.custom_joint_index];
    custom_joint->jcalc (model, joint_id, q, qdot);
  } else {
    std::ostringstream errormsg;
    errormsg << "Error: invalid joint type " << model.mJoints[joint_id].mJointType << " at id " << joint_id << std::endl;
    throw Errors::RBDLError(errormsg.str());
  }

  model.X_lambda[joint_id] = model.X_J[joint_id] * model.X_T[joint_id];
}